

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O0

bool __thiscall MipsElfFile::load(MipsElfFile *this,path *fileName,path *outputFileName)

{
  path *args;
  bool bVar1;
  Elf32_Half EVar2;
  Elf32_Addr EVar3;
  size_t sVar4;
  ElfSegment *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  Elf32_Half local_7a;
  string local_78;
  string local_48;
  path *local_28;
  path *outputFileName_local;
  path *fileName_local;
  MipsElfFile *this_local;
  
  local_28 = outputFileName;
  outputFileName_local = fileName;
  fileName_local = (path *)this;
  ghc::filesystem::path::operator=(&this->outputFileName,outputFileName);
  bVar1 = ElfFile::load(&this->elf,outputFileName_local,true);
  if (bVar1) {
    EVar2 = ElfFile::getType(&this->elf);
    if (EVar2 == 0xffa0) {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_78,outputFileName_local);
      Logger::printError<std::__cxx11::string>((Logger *)0x2,0x22adfa,(char *)&local_78,in_RCX);
      std::__cxx11::string::~string((string *)&local_78);
      this_local._7_1_ = false;
    }
    else {
      EVar2 = ElfFile::getType(&this->elf);
      args = outputFileName_local;
      if (EVar2 == 2) {
        sVar4 = ElfFile::getSegmentCount(&this->elf);
        if (sVar4 != 0) {
          this_00 = ElfFile::getSegment(&this->elf,0);
          EVar3 = ElfSegment::getVirtualAddress(this_00);
          (*(this->super_AssemblerFile)._vptr_AssemblerFile[9])(this,(ulong)EVar3);
        }
        this_local._7_1_ = true;
      }
      else {
        local_7a = ElfFile::getType(&this->elf);
        Logger::printError<ghc::filesystem::path,unsigned_short>
                  (FatalError,"Unknown ELF %s type %d",args,&local_7a);
        this_local._7_1_ = false;
      }
    }
  }
  else {
    ghc::filesystem::path::u8string_abi_cxx11_(&local_48,outputFileName_local);
    Logger::printError<std::__cxx11::string>((Logger *)0x2,0x22ade8,(char *)&local_48,in_RCX);
    std::__cxx11::string::~string((string *)&local_48);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MipsElfFile::load(const fs::path& fileName, const fs::path& outputFileName)
{
	this->outputFileName = outputFileName;

	if (!elf.load(fileName,true))
	{
		Logger::printError(Logger::FatalError, "Failed to load %s",fileName.u8string());
		return false;
	}

	if (elf.getType() == 0xFFA0)
	{
		Logger::printError(Logger::FatalError, "Relocatable ELF %s not supported yet",fileName.u8string());
		return false;
	}

	if (elf.getType() != 2)
	{
		Logger::printError(Logger::FatalError, "Unknown ELF %s type %d",fileName,elf.getType());
		return false;
	}

	if (elf.getSegmentCount() != 0)
		seekVirtual(elf.getSegment(0)->getVirtualAddress());

	return true;
}